

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::IGXMLScanner::resizeRawAttrColonList(IGXMLScanner *this)

{
  MemoryManager *pMVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  
  uVar3 = this->fRawAttrColonListSize * 2;
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  iVar4 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,(ulong)uVar3 * 4);
  piVar2 = this->fRawAttrColonList;
  for (uVar5 = 0; uVar5 < this->fRawAttrColonListSize; uVar5 = uVar5 + 1) {
    ((int *)CONCAT44(extraout_var,iVar4))[uVar5] = piVar2[uVar5];
  }
  (*((this->super_XMLScanner).fMemoryManager)->_vptr_MemoryManager[4])();
  this->fRawAttrColonList = (int *)CONCAT44(extraout_var,iVar4);
  this->fRawAttrColonListSize = uVar3;
  return;
}

Assistant:

void IGXMLScanner::resizeRawAttrColonList() {

    unsigned int newSize = fRawAttrColonListSize * 2;
    int* newRawAttrColonList = (int*) fMemoryManager->allocate
    (
        newSize * sizeof(int)
    ); //new int[newSize];

    // Copy the existing values
    unsigned int index = 0;
    for (; index < fRawAttrColonListSize; index++)
        newRawAttrColonList[index] = fRawAttrColonList[index];

    // Delete the old array and udpate our members
    fMemoryManager->deallocate(fRawAttrColonList); //delete [] fRawAttrColonList;
    fRawAttrColonList = newRawAttrColonList;
    fRawAttrColonListSize = newSize;
}